

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flag_complex_edge_collapser.h
# Opt level: O0

bool __thiscall
Gudhi::collapse::Flag_complex_edge_collapser<int,double>::
is_dominated_by<boost::container::flat_set<int,std::less<int>,void>>
          (Flag_complex_edge_collapser<int,double> *this,flat_set<int,_std::less<int>,_void> *e_ngb,
          int c,double f)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  pointer ppVar4;
  vec_iterator<std::pair<int,_double>_*,_false> *pvVar5;
  vec_iterator<int_*,_true> *l;
  int local_60;
  int vc;
  int ve;
  const_iterator ene;
  const_iterator eni;
  iterator ce;
  iterator ci;
  value_type *nc;
  double f_local;
  int c_local;
  flat_set<int,_std::less<int>,_void> *e_ngb_local;
  Flag_complex_edge_collapser<int,_double> *this_local;
  
  std::
  vector<boost::container::flat_map<int,_double,_std::less<int>,_void>,_std::allocator<boost::container::flat_map<int,_double,_std::less<int>,_void>_>_>
  ::operator[]((vector<boost::container::flat_map<int,_double,_std::less<int>,_void>,_std::allocator<boost::container::flat_map<int,_double,_std::less<int>,_void>_>_>
                *)this,(long)c);
  boost::container::flat_map<int,_double,_std::less<int>,_void>::begin
            ((flat_map<int,_double,_std::less<int>,_void> *)&ce);
  boost::container::flat_map<int,_double,_std::less<int>,_void>::end
            ((flat_map<int,_double,_std::less<int>,_void> *)&eni);
  boost::container::dtl::flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void>::
  begin((flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void> *)&ene);
  boost::container::dtl::flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void>::
  end((flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void> *)&vc);
  bVar2 = boost::container::operator!=(&ene,(vec_iterator<int_*,_true> *)&vc);
  if (!bVar2) {
    __assert_fail("eni != ene",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Collapse/include/gudhi/Flag_complex_edge_collapser.h"
                  ,0xa5,
                  "bool Gudhi::collapse::Flag_complex_edge_collapser<int, double>::is_dominated_by(const Ngb &, Vertex, Filtration_value) [Vertex = int, Filtration_value = double, Ngb = boost::container::flat_set<int>]"
                 );
  }
  bVar2 = boost::container::operator!=(&ce,(vec_iterator<std::pair<int,_double>_*,_false> *)&eni);
  if (!bVar2) {
    __assert_fail("ci != ce",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Collapse/include/gudhi/Flag_complex_edge_collapser.h"
                  ,0xa6,
                  "bool Gudhi::collapse::Flag_complex_edge_collapser<int, double>::is_dominated_by(const Ngb &, Vertex, Filtration_value) [Vertex = int, Filtration_value = double, Ngb = boost::container::flat_set<int>]"
                 );
  }
  while( true ) {
    piVar3 = boost::container::vec_iterator<int_*,_true>::operator*(&ene);
    iVar1 = *piVar3;
    ppVar4 = boost::container::vec_iterator<std::pair<int,_double>_*,_false>::operator->(&ce);
    local_60 = ppVar4->first;
    while (local_60 < iVar1) {
      pvVar5 = boost::container::vec_iterator<std::pair<int,_double>_*,_false>::operator++(&ce);
      bVar2 = boost::container::operator==
                        (pvVar5,(vec_iterator<std::pair<int,_double>_*,_false> *)&eni);
      if (bVar2) {
        return false;
      }
      ppVar4 = boost::container::vec_iterator<std::pair<int,_double>_*,_false>::operator->(&ce);
      local_60 = ppVar4->first;
    }
    if (iVar1 < local_60) {
      return false;
    }
    ppVar4 = boost::container::vec_iterator<std::pair<int,_double>_*,_false>::operator->(&ce);
    if (f < ppVar4->second) {
      return false;
    }
    l = boost::container::vec_iterator<int_*,_true>::operator++(&ene);
    bVar2 = boost::container::operator==(l,(vec_iterator<int_*,_true> *)&vc);
    if (bVar2) break;
    pvVar5 = boost::container::vec_iterator<std::pair<int,_double>_*,_false>::operator++(&ce);
    bVar2 = boost::container::operator==
                      (pvVar5,(vec_iterator<std::pair<int,_double>_*,_false> *)&eni);
    if (bVar2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool is_dominated_by(Ngb const& e_ngb, Vertex c, Filtration_value f){
    // The best strategy probably depends on the distribution, how sparse / dense the adjacency matrix is,
    // how (un)balanced the sizes of e_ngb and nc are.
    // Some efficient operations on sets work best with bitsets, although the need for a map complicates things.
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
    for(auto v : e_ngb) {
      // if(v==c)continue;
      if(neighbors_dense(v,c) > f) return false;
    }
    return true;
#else
    auto&&nc = neighbors[c];
    // if few neighbors, use dichotomy? Seems slower.
    // I tried storing a copy of neighbors as a vector<absl::flat_hash_map> and using it for nc, but it was
    // a bit slower here. It did help with neighbors[dominator].find(w) in the main function though,
    // sometimes enough, sometimes not.
    auto ci = nc.begin();
    auto ce = nc.end();
    auto eni = e_ngb.begin();
    auto ene = e_ngb.end();
    assert(eni != ene);
    assert(ci != ce);
    // if(*eni == c && ++eni == ene) return true;
    for(;;){
      Vertex ve = *eni;
      Vertex vc = ci->first;
      while(ve > vc) {
        // try a gallop strategy (exponential search)? Seems slower
        if(++ci == ce) return false;
        vc = ci->first;
      }
      if(ve < vc) return false;
      // ve == vc
      if(ci->second > f) return false;
      if(++eni == ene)return true;
      // If we stored an open neighborhood of c (excluding c), we would need to test for c here and before the loop
      // if(*eni == c && ++eni == ene)return true;
      if(++ci == ce) return false;
    }
#endif
  }